

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O1

Vector * GMRESIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
                  double OmegaPrecond)

{
  size_t __size;
  double dVar1;
  void *__ptr;
  bool bVar2;
  bool bVar3;
  LASErrIdType LVar4;
  Boolean BVar5;
  int iVar6;
  long lVar7;
  void *__ptr_00;
  void *pvVar8;
  void *__ptr_01;
  void *__ptr_02;
  void *__ptr_03;
  size_t Dim;
  Vector *__ptr_04;
  Vector *pVVar9;
  long lVar10;
  Vector *pVVar11;
  Vector *V2;
  long lVar12;
  long lVar13;
  Vector *pVVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  double bNorm;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  char vName [10];
  char local_3a [10];
  
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  iVar6 = GMRESSteps;
  uVar17 = (ulong)(uint)GMRESSteps;
  lVar7 = (long)GMRESSteps;
  __size = lVar7 * 8 + 8;
  __ptr_00 = malloc(__size);
  bVar2 = false;
  if (__ptr_00 != (void *)0x0) {
    if (iVar6 < 1) {
      bVar2 = true;
    }
    else {
      bVar2 = true;
      uVar16 = 1;
      do {
        pvVar8 = malloc(uVar17 * 8 + 0x10);
        *(void **)((long)__ptr_00 + uVar16 * 8) = pvVar8;
        if (pvVar8 == (void *)0x0) {
          bVar2 = false;
        }
        uVar16 = uVar16 + 1;
      } while (iVar6 + 1 != uVar16);
    }
  }
  pvVar8 = malloc(__size);
  __ptr_01 = malloc(lVar7 * 8 + 0x10);
  __ptr_02 = malloc(__size);
  __ptr_03 = malloc(__size);
  if (__ptr_01 == (void *)0x0) {
    bVar2 = false;
  }
  if (pvVar8 == (void *)0x0) {
    bVar2 = false;
  }
  if (__ptr_02 == (void *)0x0) {
    bVar2 = false;
  }
  if (__ptr_03 == (void *)0x0) {
    bVar2 = false;
  }
  Dim = Q_GetDim(A);
  __ptr_04 = (Vector *)malloc((long)GMRESSteps * 0x30 + 0x60);
  bVar3 = false;
  if ((__ptr_04 != (Vector *)0x0) && (bVar3 = bVar2, -1 < GMRESSteps)) {
    uVar17 = 1;
    lVar7 = 0;
    pVVar9 = __ptr_04;
    do {
      pVVar9 = pVVar9 + 1;
      sprintf(local_3a,"v[%d]",(ulong)((int)(uVar17 / 1000) * -1000 + (int)lVar7 + 1));
      V_Constr(pVVar9,local_3a,Dim,Normal,True);
      lVar7 = lVar7 + 1;
      uVar17 = (ulong)((int)uVar17 + 1);
    } while (lVar7 <= GMRESSteps);
  }
  if (!bVar3) {
    LASError(LASMemAllocErr,"GMRESIter",(char *)0x0,(char *)0x0,(char *)0x0);
  }
  LVar4 = LASResult();
  if (LVar4 == LASOK) {
    bNorm = l2Norm_V(b);
    dVar18 = l1Norm_V(x);
    auVar20._8_4_ = (int)(Dim >> 0x20);
    auVar20._0_8_ = Dim;
    auVar20._12_4_ = 0x45300000;
    pVVar9 = b;
    if (2.2250738585072014e-307 <=
        ABS(dVar18 / ((auVar20._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)Dim) - 4503599627370496.0)))) {
      BVar5 = Q_KerDefined(A);
      if (BVar5 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar9 = Mul_QV(A,x);
      pVVar9 = Sub_VV(b,pVVar9);
    }
    Asgn_VV(__ptr_04 + 1,pVVar9);
    pVVar9 = __ptr_04 + 1;
    dVar18 = l2Norm_V(pVVar9);
    iVar6 = 0;
    BVar5 = RTCResult(0,dVar18,bNorm,GMRESIterId);
    if (0 < MaxIter && BVar5 == False) {
      do {
        if (PrecondProc != (PrecondProcType)0x0) {
          (*PrecondProc)(A,pVVar9,pVVar9,OmegaPrecond);
        }
        dVar18 = l2Norm_V(pVVar9);
        *(double *)((long)__ptr_01 + 8) = dVar18;
        MulAsgn_VS(pVVar9,1.0 / dVar18);
        lVar10 = 1;
        pVVar14 = __ptr_04;
        lVar7 = 0;
        while ((((PrecondProc != (PrecondProcType)0x0 ||
                 (BVar5 = RTCResult(iVar6,ABS(*(double *)((long)__ptr_01 + lVar7 * 8 + 8)),bNorm,
                                    GMRESIterId), BVar5 == False)) && (lVar7 < GMRESSteps)) &&
               (iVar6 < MaxIter))) {
          lVar13 = lVar7 + 1;
          pVVar11 = Mul_QV(A,__ptr_04 + lVar13);
          if (PrecondProc == (PrecondProcType)0x0) {
            Asgn_VV(__ptr_04 + lVar7 + 2,pVVar11);
          }
          else {
            (*PrecondProc)(A,__ptr_04 + lVar7 + 2,pVVar11,OmegaPrecond);
          }
          iVar6 = iVar6 + 1;
          lVar15 = 0;
          pVVar11 = pVVar9;
          do {
            dVar18 = Mul_VV(__ptr_04 + lVar7 + 2,pVVar11);
            *(double *)(*(long *)((long)__ptr_00 + lVar13 * 8) + 8 + lVar15 * 8) = dVar18;
            V2 = Mul_SV(dVar18,pVVar11);
            SubAsgn_VV(__ptr_04 + lVar7 + 2,V2);
            lVar15 = lVar15 + 1;
            pVVar11 = pVVar11 + 1;
          } while (lVar10 != lVar15);
          dVar18 = l2Norm_V(__ptr_04 + lVar7 + 2);
          lVar15 = *(long *)((long)__ptr_00 + lVar13 * 8);
          *(double *)(lVar15 + 0x10 + lVar7 * 8) = dVar18;
          MulAsgn_VS(__ptr_04 + lVar7 + 2,1.0 / dVar18);
          if (lVar7 != 0) {
            dVar18 = *(double *)(lVar15 + 8);
            lVar12 = 0;
            do {
              dVar19 = *(double *)((long)__ptr_02 + lVar12 * 8 + 8);
              dVar21 = *(double *)((long)__ptr_03 + lVar12 * 8 + 8);
              dVar1 = *(double *)(lVar15 + 0x10 + lVar12 * 8);
              dVar22 = dVar19 * dVar18;
              dVar18 = dVar19 * dVar1 - dVar21 * dVar18;
              *(double *)(lVar15 + 8 + lVar12 * 8) = dVar22 + dVar21 * dVar1;
              *(double *)(lVar15 + 0x10 + lVar12 * 8) = dVar18;
              lVar12 = lVar12 + 1;
            } while (lVar7 != lVar12);
          }
          dVar18 = *(double *)(lVar15 + lVar13 * 8);
          dVar19 = *(double *)(lVar15 + 0x10 + lVar7 * 8);
          dVar18 = dVar18 * dVar18 + dVar19 * dVar19;
          if (dVar18 < 0.0) {
            dVar18 = sqrt(dVar18);
          }
          else {
            dVar18 = SQRT(dVar18);
          }
          dVar19 = *(double *)(lVar15 + lVar13 * 8) / dVar18;
          *(double *)((long)__ptr_02 + lVar13 * 8) = dVar19;
          dVar21 = *(double *)(lVar15 + 0x10 + lVar7 * 8) / dVar18;
          *(double *)((long)__ptr_03 + lVar13 * 8) = dVar21;
          *(double *)(lVar15 + lVar13 * 8) = dVar18;
          *(undefined8 *)(lVar15 + 0x10 + lVar7 * 8) = 0;
          dVar18 = *(double *)((long)__ptr_01 + lVar13 * 8);
          *(double *)((long)__ptr_01 + lVar7 * 8 + 0x10) = -dVar21 * dVar18;
          *(double *)((long)__ptr_01 + lVar13 * 8) = dVar19 * dVar18;
          lVar10 = lVar10 + 1;
          pVVar14 = pVVar14 + 1;
          lVar7 = lVar13;
        }
        lVar13 = lVar10;
        if (lVar7 != 0) {
          do {
            lVar15 = *(long *)((long)__ptr_00 + lVar7 * 8);
            dVar18 = *(double *)((long)__ptr_01 + lVar7 * 8) / *(double *)(lVar15 + lVar7 * 8);
            *(double *)((long)pvVar8 + lVar7 * 8) = dVar18;
            lVar12 = lVar13;
            if (1 < lVar7) {
              do {
                uVar17 = (ulong)((int)lVar12 - 2);
                *(double *)((long)__ptr_01 + uVar17 * 8) =
                     *(double *)((long)__ptr_01 + uVar17 * 8) -
                     *(double *)(lVar15 + uVar17 * 8) * dVar18;
                lVar12 = lVar12 + -1;
              } while (2 < lVar12);
            }
            bVar2 = 1 < lVar7;
            lVar13 = lVar13 + -1;
            lVar7 = lVar7 + -1;
          } while (bVar2);
          do {
            pVVar11 = Mul_SV(*(double *)((long)pvVar8 + lVar10 * 8 + -8),pVVar14);
            AddAsgn_VV(x,pVVar11);
            lVar10 = lVar10 + -1;
            pVVar14 = pVVar14 + -1;
          } while (1 < lVar10);
        }
        BVar5 = Q_KerDefined(A);
        if (BVar5 != False) {
          OrthoRightKer_VQ(x,A);
        }
        pVVar14 = Mul_QV(A,x);
        pVVar14 = Sub_VV(b,pVVar14);
        Asgn_VV(pVVar9,pVVar14);
        dVar18 = l2Norm_V(pVVar9);
        BVar5 = RTCResult(iVar6,dVar18,bNorm,GMRESIterId);
      } while ((BVar5 == False) && (iVar6 < MaxIter));
    }
  }
  if (__ptr_04 != (Vector *)0x0) {
    if (-1 < GMRESSteps) {
      lVar7 = 0;
      pVVar9 = __ptr_04;
      do {
        pVVar9 = pVVar9 + 1;
        V_Destr(pVVar9);
        lVar7 = lVar7 + 1;
      } while (lVar7 <= GMRESSteps);
    }
    free(__ptr_04);
  }
  if (__ptr_00 != (void *)0x0) {
    uVar17 = (ulong)(uint)GMRESSteps;
    if (0 < GMRESSteps) {
      lVar7 = 1;
      do {
        __ptr = *(void **)((long)__ptr_00 + lVar7 * 8);
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        lVar7 = lVar7 + 1;
      } while (uVar17 + 1 != lVar7);
    }
    free(__ptr_00);
  }
  if (pvVar8 != (void *)0x0) {
    free(pvVar8);
  }
  if (__ptr_01 != (void *)0x0) {
    free(__ptr_01);
  }
  if (__ptr_02 != (void *)0x0) {
    free(__ptr_02);
  }
  if (__ptr_03 != (void *)0x0) {
    free(__ptr_03);
  }
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *GMRESIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    /*
     *  for details to the algorithm see
     *
     *  R. Barrett, M. Berry, T. F. Chan, J. Demmel, J. Donato, J. Dongarra,
     *  V. Eijkhout, R. Pozo, Ch. Romine, H. van der Vorst:
     *  Templates for the Solution of Linear Systems: Building Blocks
     *  for Iterative Solvers;
     *  SIAM, Philadelphia, 1994
     *
     */

    char vName[10];
    int Iter, i, j, k;
    double h1, h2, r;
    double bNorm;
    double **h, *y, *s, *c1, *c2;
    size_t Dim;
    Boolean AllocOK;
    Vector *v;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    /* allocation of matrix H and vectors y, s, c1 and c2 */
    AllocOK = True;
    h = (double **)malloc((GMRESSteps + 1) * sizeof(double *));
    if (h == NULL) {
        AllocOK = False;
    } else {
        for (i = 1; i <= GMRESSteps; i++) {
            h[i] = (double *)malloc((GMRESSteps + 2) * sizeof(double));
            if (h[i] == NULL)
                AllocOK = False;
	}
    }
    y = (double *)malloc((GMRESSteps + 1) * sizeof(double));
    if (y == NULL)
        AllocOK = False;
    s = (double *)malloc((GMRESSteps + 2) * sizeof(double));
    if (s == NULL)
        AllocOK = False;
    c1 = (double *)malloc((GMRESSteps + 1) * sizeof(double));
    if (c1 == NULL)
        AllocOK = False;
    c2 = (double *)malloc((GMRESSteps + 1) * sizeof(double));
    if (c2 == NULL)
        AllocOK = False;

    /* ... and vectors u */    
    Dim = Q_GetDim(A);
    v = (Vector *)malloc((GMRESSteps + 2) * sizeof(Vector));
    if (v == NULL)
        AllocOK = False;
    else
        for (i = 1; i <= GMRESSteps + 1; i++) {
	    sprintf(vName, "v[%d]", i % 1000);
            V_Constr(&v[i], vName, Dim, Normal, True);
	}

    if (!AllocOK)
        LASError(LASMemAllocErr, "GMRESIter", NULL, NULL, NULL);
        
    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        /* loop for 'MaxIter' GMRES cycles */
        Iter = 0;
        /* v[1] = r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&v[1], Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&v[1], b);
	}
        while (!RTCResult(Iter, l2Norm_V(&v[1]), bNorm, GMRESIterId)
            && Iter < MaxIter) {
            if (PrecondProc != NULL)
	        (*PrecondProc)(A, &v[1], &v[1], OmegaPrecond);
            s[1] = l2Norm_V(&v[1]);
            MulAsgn_VS(&v[1], 1.0 / s[1]);

            /* GMRES iteration */
            i = 0;
            while ((PrecondProc != NULL ? True : !RTCResult(Iter, fabs(s[i+1]),
                bNorm, GMRESIterId)) && i < GMRESSteps && Iter < MaxIter) {
 	        i++;
		Iter++;
                /* w = v[i+1] */
                if (PrecondProc != NULL) 
		    (*PrecondProc)(A, &v[i+1], Mul_QV(A, &v[i]), OmegaPrecond);
                else
                    Asgn_VV(&v[i+1], Mul_QV(A, &v[i]));

                /* modified Gram-Schmidt orthogonalization */
                for (k = 1; k <= i; k++) {
                    h[i][k] = Mul_VV(&v[i+1], &v[k]);
                    SubAsgn_VV(&v[i+1], Mul_SV(h[i][k], &v[k]));
                }

                h[i][i+1] = l2Norm_V(&v[i+1]);
                MulAsgn_VS(&v[i+1], 1.0 / h[i][i+1]);

                /* Q-R algorithm */
                for (k = 1; k < i; k++) {
                    h1 = c1[k] * h[i][k] + c2[k] * h[i][k+1];
                    h2 = - c2[k] * h[i][k] + c1[k] * h[i][k+1];
                    h[i][k] = h1;
                    h[i][k+1] = h2;
                }
                r = sqrt(h[i][i] * h[i][i] + h[i][i+1] * h[i][i+1]);
                c1[i] = h[i][i] / r;
                c2[i] = h[i][i+1] / r;
                h[i][i] = r;
                h[i][i+1] = 0.0;
                s[i+1] = - c2[i] * s[i];
                s[i] = c1[i] * s[i];
            }

            /* Solving of the system of equations : H y = s */
            for (j = i; j > 0; j--) {
                y[j] = s[j] / h[j][j];
                for (k = j - 1; k > 0; k--)
                    s[k] -= h[j][k] * y[j];
            }

            /* updating solution */
            for (j = i; j > 0; j--)
                AddAsgn_VV(x, Mul_SV(y[j], &v[j]));
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
                
            /* computing new residual */
            Asgn_VV(&v[1], Sub_VV(b, Mul_QV(A, x)));
        }
    }

    /* release of vectors u, matrix H and vectors y, s, c1 and c2 */
    if (v != NULL) {
        for (i = 1; i <= GMRESSteps + 1; i++)
            V_Destr(&v[i]);
        free(v);
    }

    if (h != NULL) {
        for (i = 1; i <= GMRESSteps; i++)
	    if (h[i] != NULL)
                free(h[i]);
        free(h);
    }
    if (y != NULL)
        free(y);
    if (s != NULL)
        free(s);
    if (c1 != NULL)
        free(c1);
    if (c2 != NULL)
        free(c2);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}